

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void FlushSnapshotToDisk(CCoinsViewCache *coins_cache,bool snapshot_loaded)

{
  string prefix;
  string end_msg;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  undefined7 in_register_00000031;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer49;
  undefined8 in_stack_ffffffffffffff28;
  _Alloc_hider in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  long *plVar4;
  long local_90 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_80;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff60,"FlushSnapshotToDisk","");
  pcVar2 = "flushing coins cache";
  if ((int)CONCAT71(in_register_00000031,snapshot_loaded) != 0) {
    pcVar2 = "saving snapshot chainstate";
  }
  sVar1 = CCoinsViewCache::DynamicMemoryUsage(coins_cache);
  pcVar3 = (char *)(sVar1 / 1000000);
  tinyformat::format<char_const*,unsigned_long>
            ((string *)&stack0xffffffffffffff40,(tinyformat *)"%s (%.2f MB)",
             &stack0xffffffffffffff38,(char **)&stack0xffffffffffffff30,in_R8);
  prefix._M_string_length = (size_type)pcVar3;
  prefix._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff28;
  prefix.field_2._M_allocated_capacity = (size_type)pcVar2;
  prefix.field_2._8_8_ = in_stack_ffffffffffffff40._M_p;
  end_msg._M_string_length = in_stack_ffffffffffffff50;
  end_msg._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
  end_msg.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
  end_msg.field_2._8_8_ = plVar4;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&local_80,prefix,end_msg,(LogFlags)&stack0xffffffffffffff60,
             SUB81(&stack0xffffffffffffff40,0));
  if (in_stack_ffffffffffffff40._M_p != &stack0xffffffffffffff50) {
    operator_delete(in_stack_ffffffffffffff40._M_p,in_stack_ffffffffffffff50 + 1);
  }
  if (plVar4 != local_90) {
    operator_delete(plVar4,local_90[0] + 1);
  }
  CCoinsViewCache::Flush(coins_cache);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void FlushSnapshotToDisk(CCoinsViewCache& coins_cache, bool snapshot_loaded)
{
    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("%s (%.2f MB)",
                  snapshot_loaded ? "saving snapshot chainstate" : "flushing coins cache",
                  coins_cache.DynamicMemoryUsage() / (1000 * 1000)),
        BCLog::LogFlags::ALL);

    coins_cache.Flush();
}